

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.c
# Opt level: O2

void wake_nearby(void)

{
  uint uVar1;
  int iVar2;
  monst *pmVar3;
  
  pmVar3 = (monst *)&level->monlist;
  while (pmVar3 = pmVar3->nmon, pmVar3 != (monst *)0x0) {
    if (0 < pmVar3->mhp) {
      iVar2 = dist2((int)pmVar3->mx,(int)pmVar3->my,(int)u.ux,(int)u.uy);
      if ((SBORROW4(iVar2,u.ulevel * 0x14) != iVar2 + u.ulevel * -0x14 < 0) &&
         (uVar1 = *(uint *)&pmVar3->field_0x60, *(uint *)&pmVar3->field_0x60 = uVar1 & 0xfff7ffff,
         (uVar1 >> 0x1a & 1) == 0 && pmVar3->mtame != '\0')) {
        *(uint *)&pmVar3[1].data = moves;
      }
    }
  }
  return;
}

Assistant:

void wake_nearby(void)
{
	struct monst *mtmp;

	for (mtmp = level->monlist; mtmp; mtmp = mtmp->nmon) {
	    if (!DEADMONSTER(mtmp) && distu(mtmp->mx,mtmp->my) < u.ulevel*20) {
		mtmp->msleeping = 0;
		if (mtmp->mtame && !mtmp->isminion)
		    EDOG(mtmp)->whistletime = moves;
	    }
	}
}